

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

MemoryLeakDetectorNode * __thiscall
MemoryLeakDetectorTable::getFirstLeak(MemoryLeakDetectorTable *this,MemLeakPeriod period)

{
  MemoryLeakDetectorNode *cur;
  MemoryLeakDetectorNode *pMVar1;
  int i;
  long lVar2;
  
  lVar2 = 0;
  do {
    pMVar1 = this->table_[lVar2].head_;
    if (pMVar1 == (MemoryLeakDetectorNode *)0x0 || period == mem_leak_period_all) {
      if (pMVar1 != (MemoryLeakDetectorNode *)0x0) {
        return pMVar1;
      }
    }
    else {
      do {
        if (*(MemLeakPeriod *)(pMVar1 + 0x30) == period) {
          return pMVar1;
        }
        if (period == mem_leak_period_enabled &&
            *(MemLeakPeriod *)(pMVar1 + 0x30) != mem_leak_period_disabled) {
          return pMVar1;
        }
        pMVar1 = *(MemoryLeakDetectorNode **)(pMVar1 + 0x38);
      } while (pMVar1 != (MemoryLeakDetectorNode *)0x0);
    }
    lVar2 = lVar2 + 1;
    if (lVar2 == 0x49) {
      return (MemoryLeakDetectorNode *)0x0;
    }
  } while( true );
}

Assistant:

MemoryLeakDetectorNode* MemoryLeakDetectorTable::getFirstLeak(MemLeakPeriod period)
{
    for (int i = 0; i < hash_prime; i++) {
        MemoryLeakDetectorNode* node = table_[i].getFirstLeak(period);
        if (node) return node;
    }
    return NULLPTR;
}